

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O2

void wallet::wallet_tests::PollutePubKey(CPubKey *pubkey)

{
  byte bVar1;
  bool bVar2;
  size_type __n;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_raw;
  CPubKey local_59;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = pubkey->vch[0];
  if (((bVar1 & 0xfe) != 2) && ((7 < bVar1 || ((0xd0U >> (bVar1 & 0x1f) & 1) == 0)))) {
    __assert_fail("pubkey.size() >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x218,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&pubkey_raw,pubkey->vch);
  if ((pubkey->vch[0] & 0xfe) == 2) {
    __n = 0x20;
  }
  else {
    bVar1 = pubkey->vch[0] - 4;
    __n = 0xffffffff;
    if (bVar1 < 4) {
      __n = *(size_type *)(&DAT_00c85490 + (ulong)bVar1 * 8);
    }
  }
  local_59.vch[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            (&pubkey_raw,
             (const_iterator)
             pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,__n,local_59.vch);
  CPubKey::Set<unsigned_char_const*>
            (&local_59,
             pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,
             pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  memcpy(pubkey,&local_59,0x41);
  bVar2 = CPubKey::IsFullyValid(pubkey);
  if (!bVar2) {
    bVar1 = pubkey->vch[0];
    if (((bVar1 & 0xfe) != 2) && ((7 < bVar1 || ((0xd0U >> (bVar1 & 0x1f) & 1) == 0)))) {
      __assert_fail("pubkey.IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                    ,0x21e,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&pubkey_raw.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("!pubkey.IsFullyValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                ,0x21d,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
}

Assistant:

static void PollutePubKey(CPubKey& pubkey)
{
    assert(pubkey.size() >= 1);
    std::vector<unsigned char> pubkey_raw;
    pubkey_raw.push_back(pubkey[0]);
    pubkey_raw.insert(pubkey_raw.end(), pubkey.size() - 1, 0);
    pubkey = CPubKey(pubkey_raw);
    assert(!pubkey.IsFullyValid());
    assert(pubkey.IsValid());
}